

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O1

bool_t rngIsValid(void)

{
  bool_t bVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (_inited == '\x01') {
    mtMtxLock(_mtx);
    uVar2 = 0;
    if (_state != (rng_state_st *)0x0 && _ctr != 0) {
      bVar1 = blobIsValid(_state);
      uVar2 = (uint)(bVar1 != 0);
    }
    mtMtxUnlock(_mtx);
  }
  return uVar2;
}

Assistant:

bool_t rngIsValid()
{
	bool_t b;
	if (!_inited)
		return FALSE;
	mtMtxLock(_mtx);
	b = rngIsValid_internal();
	mtMtxUnlock(_mtx);
	return b;
}